

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_linpart.cpp
# Opt level: O3

Remotes * Omega_h::globals_to_linear_owners
                    (Remotes *__return_storage_ptr__,Read<long> *globals,GO total,I32 comm_size)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Alloc *pAVar3;
  long lVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  Remotes *this;
  int iVar8;
  long lVar9;
  ulong **__dest;
  long *plVar10;
  ulong *puVar11;
  undefined4 uVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  int iVar16;
  size_type sVar17;
  ScopedTimer omega_h_scoped_function_timer;
  Write<int> idxs;
  Write<int> ranks;
  size_type __dnew;
  type f;
  ScopedTimer local_1c9;
  string local_1c8;
  void *local_1a8;
  long local_1a0;
  Alloc *local_198;
  void *local_190;
  long local_188;
  Write<int> local_180;
  Write<int> local_170;
  ulong *local_160;
  long local_158;
  ulong local_150 [2];
  long local_140;
  long local_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  Write<int> local_110;
  Write<int> local_100;
  ulong **local_f0;
  ulong *local_e8;
  ulong *local_e0 [2];
  Alloc *local_d0;
  Alloc *local_c8;
  Alloc *local_c0;
  void *local_b8;
  size_t local_b0;
  long local_a8;
  Remotes *local_a0;
  Read<signed_char> local_98;
  Read<signed_char> local_88;
  Alloc *local_78;
  void *pvStack_70;
  size_t local_68;
  Alloc *local_60;
  void *pvStack_58;
  long local_50;
  Alloc *local_48;
  void *pvStack_40;
  long local_38;
  
  lVar9 = total / (long)comm_size;
  local_138 = total % (long)comm_size;
  pAVar3 = (globals->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar15 = pAVar3->size;
  }
  else {
    sVar15 = (ulong)pAVar3 >> 3;
  }
  paVar2 = &local_1c8.field_2;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  Write<int>::Write(&local_170,(LO)(sVar15 >> 3),&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (globals->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar15 = pAVar3->size;
  }
  else {
    sVar15 = (ulong)pAVar3 >> 3;
  }
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  Write<int>::Write(&local_180,(LO)(sVar15 >> 3),&local_1c8);
  local_a8 = lVar9 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  pvVar6 = local_170.shared_alloc_.direct_ptr;
  pvVar5 = local_180.shared_alloc_.direct_ptr;
  local_b0 = local_a8 * local_138;
  pAVar3 = (globals->write_).shared_alloc_.alloc;
  local_78 = pAVar3;
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&pAVar3->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      pAVar3->use_count = pAVar3->use_count + 1;
    }
  }
  local_b8 = (globals->write_).shared_alloc_.direct_ptr;
  local_60 = local_170.shared_alloc_.alloc;
  if (((ulong)local_170.shared_alloc_.alloc & 7) == 0 &&
      local_170.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60 = (Alloc *)((local_170.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_170.shared_alloc_.alloc)->use_count = (local_170.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_58 = local_170.shared_alloc_.direct_ptr;
  local_48 = local_180.shared_alloc_.alloc;
  if (((ulong)local_180.shared_alloc_.alloc & 7) == 0 &&
      local_180.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48 = (Alloc *)((local_180.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_180.shared_alloc_.alloc)->use_count = (local_180.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_40 = local_180.shared_alloc_.direct_ptr;
  local_38 = local_138;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar17 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&pAVar3->size)->_M_allocated_capacity;
  }
  else {
    sVar17 = (ulong)pAVar3 >> 3;
  }
  local_f0 = local_e0;
  local_160 = (ulong *)0x5d;
  local_140 = lVar9;
  local_d0 = local_48;
  local_c8 = local_78;
  local_c0 = local_60;
  local_a0 = __return_storage_ptr__;
  pvStack_70 = local_b8;
  local_68 = local_b0;
  local_50 = lVar9;
  __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_f0,(ulong)&local_160);
  puVar11 = local_160;
  local_e0[0] = local_160;
  local_f0 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_e8 = puVar11;
  *(undefined1 *)((long)__dest + (long)puVar11) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_f0);
  lVar9 = local_140;
  puVar11 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar11) {
    local_120 = *puVar11;
    lStack_118 = plVar10[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar11;
    local_130 = (ulong *)*plVar10;
  }
  local_128 = plVar10[1];
  *plVar10 = (long)puVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_160 = local_150;
  std::__cxx11::string::_M_construct((ulong)&local_160,'\x02');
  *(undefined2 *)local_160 = 0x3438;
  uVar14 = 0xf;
  if (local_130 != &local_120) {
    uVar14 = local_120;
  }
  if (uVar14 < (ulong)(local_158 + local_128)) {
    uVar14 = 0xf;
    if (local_160 != local_150) {
      uVar14 = local_150[0];
    }
    if ((ulong)(local_158 + local_128) <= uVar14) {
      plVar10 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_160,0,(char *)0x0,(ulong)local_130);
      goto LAB_002f5056;
    }
  }
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_160);
LAB_002f5056:
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  pAVar3 = (Alloc *)(plVar10 + 2);
  if ((Alloc *)*plVar10 == pAVar3) {
    local_1c8.field_2._M_allocated_capacity = pAVar3->size;
    local_1c8.field_2._8_8_ = plVar10[3];
  }
  else {
    local_1c8.field_2._M_allocated_capacity = pAVar3->size;
    local_1c8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_1c8._M_string_length = plVar10[1];
  *plVar10 = (long)pAVar3;
  plVar10[1] = 0;
  *(undefined1 *)&pAVar3->size = 0;
  begin_code("parallel_for",local_1c8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  lVar7 = local_a8;
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,(long)local_e0[0] + 1);
  }
  iVar16 = (int)(sVar17 >> 3);
  if (0 < iVar16) {
    local_1c8._M_dataplus._M_p = (pointer)local_c8;
    local_1c8._M_string_length = (size_type)local_b8;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      local_c8->use_count = local_c8->use_count + -1;
      local_1c8._M_dataplus._M_p =
           (pointer)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_c8->size)->_M_allocated_capacity * 8 + 1);
    }
    local_78 = (Alloc *)0x0;
    pvStack_70 = (void *)0x0;
    local_1c8.field_2._M_allocated_capacity = local_b0;
    local_1c8.field_2._8_8_ = local_c0;
    local_1a8 = pvVar6;
    if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
      local_c0->use_count = local_c0->use_count + -1;
      local_1c8.field_2._8_8_ = local_c0->size * 8 + 1;
    }
    local_60 = (Alloc *)0x0;
    pvStack_58 = (void *)0x0;
    local_1a0 = lVar9;
    local_198 = local_d0;
    local_190 = pvVar5;
    if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
      local_d0->use_count = local_d0->use_count + -1;
      local_198 = (Alloc *)(local_d0->size * 8 + 1);
    }
    local_48 = (Alloc *)0x0;
    pvStack_40 = (void *)0x0;
    local_188 = local_138;
    entering_parallel = '\0';
    lVar13 = 0;
    do {
      lVar4 = *(long *)((long)local_b8 + lVar13 * 8);
      if (lVar4 < (long)local_b0) {
        iVar8 = (int)(lVar4 / lVar7);
        uVar12 = (undefined4)(lVar4 % lVar7);
      }
      else {
        uVar12 = (undefined4)((long)(lVar4 - local_b0) % lVar9);
        iVar8 = (int)((long)(lVar4 - local_b0) / lVar9) + (int)local_138;
      }
      *(int *)((long)pvVar6 + lVar13 * 4) = iVar8;
      *(undefined4 *)((long)pvVar5 + lVar13 * 4) = uVar12;
      lVar13 = lVar13 + 1;
    } while (iVar16 != (int)lVar13);
    globals_to_linear_owners(Omega_h::Read<long>,long,int)::$_0::~__0((__0 *)&local_1c8);
  }
  ScopedTimer::~ScopedTimer(&local_1c9);
  this = local_a0;
  local_100.shared_alloc_.alloc = local_170.shared_alloc_.alloc;
  if (((ulong)local_170.shared_alloc_.alloc & 7) == 0 &&
      local_170.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.shared_alloc_.alloc = (Alloc *)((local_170.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_170.shared_alloc_.alloc)->use_count = (local_170.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_100.shared_alloc_.direct_ptr = local_170.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_88,&local_100);
  local_110.shared_alloc_.alloc = local_180.shared_alloc_.alloc;
  if (((ulong)local_180.shared_alloc_.alloc & 7) == 0 &&
      local_180.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_110.shared_alloc_.alloc = (Alloc *)((local_180.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_180.shared_alloc_.alloc)->use_count = (local_180.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_110.shared_alloc_.direct_ptr = local_180.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_98,&local_110);
  Remotes::Remotes(this,(Read<int> *)&local_88,(LOs *)&local_98);
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
      operator_delete(local_98.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_110.shared_alloc_.alloc;
  if (((ulong)local_110.shared_alloc_.alloc & 7) == 0 &&
      local_110.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_110.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_110.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
      operator_delete(local_88.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_100.shared_alloc_.alloc;
  if (((ulong)local_100.shared_alloc_.alloc & 7) == 0 &&
      local_100.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_100.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_100.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  globals_to_linear_owners(Omega_h::Read<long>,long,int)::$_0::~__0((__0 *)&local_78);
  if (((ulong)local_180.shared_alloc_.alloc & 7) == 0 &&
      local_180.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_180.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_180.shared_alloc_.alloc);
      operator_delete(local_180.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_170.shared_alloc_.alloc & 7) == 0 &&
      local_170.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_170.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_170.shared_alloc_.alloc);
      operator_delete(local_170.shared_alloc_.alloc,0x48);
    }
  }
  return this;
}

Assistant:

Remotes globals_to_linear_owners(Read<GO> globals, GO total, I32 comm_size) {
  auto const comm_size_gt = GO(comm_size);
  auto const quot = total / comm_size_gt;
  auto const rem = total % comm_size_gt;
  auto const split = ((quot + 1) * rem);
  Write<I32> ranks(globals.size());
  Write<LO> idxs(globals.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    if (globals[i] < split) {
      ranks[i] = static_cast<I32>(globals[i] / (quot + 1));
      idxs[i] = static_cast<LO>(globals[i] % (quot + 1));
    } else {
      auto const g = globals[i] - split;
      ranks[i] = static_cast<I32>(g / quot + rem);
      idxs[i] = static_cast<LO>(g % quot);
    }
  };
  parallel_for(globals.size(), std::move(f));
  return Remotes(ranks, idxs);
}